

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O1

void __thiscall hdc::Lex::getNextToken(Lex *this)

{
  char cVar1;
  ulong uVar2;
  _Map_pointer ppTVar3;
  bool bVar4;
  undefined8 in_RAX;
  ulong uVar5;
  ostream *poVar6;
  undefined8 uStack_18;
  
  uVar5 = (ulong)this->idx;
  uVar2 = (this->buffer)._M_string_length;
  if (uVar5 < uVar2) {
    if ((this->buffer)._M_dataplus._M_p[uVar5] == '\n') {
      if ((this->newline == false) &&
         (ppTVar3 = (this->blockStack).c.
                    super__Deque_base<hdc::TokenKind,_std::allocator<hdc::TokenKind>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_node,
         ((long)(this->blockStack).c.
                super__Deque_base<hdc::TokenKind,_std::allocator<hdc::TokenKind>_>._M_impl.
                super__Deque_impl_data._M_start._M_last -
          (long)(this->blockStack).c.
                super__Deque_base<hdc::TokenKind,_std::allocator<hdc::TokenKind>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur >> 2) +
         ((long)(this->blockStack).c.
                super__Deque_base<hdc::TokenKind,_std::allocator<hdc::TokenKind>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur -
          (long)(this->blockStack).c.
                super__Deque_base<hdc::TokenKind,_std::allocator<hdc::TokenKind>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first >> 2) +
         ((((ulong)((long)ppTVar3 -
                   (long)(this->blockStack).c.
                         super__Deque_base<hdc::TokenKind,_std::allocator<hdc::TokenKind>_>._M_impl.
                         super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
         (ulong)(ppTVar3 == (_Map_pointer)0x0)) * 0x80 == 0)) {
        createToken(this,TK_NEWLINE);
      }
      advance(this);
      return;
    }
    if ((uVar5 < uVar2) && ((this->buffer)._M_dataplus._M_p[uVar5] == '#')) {
      while (((this->buffer)._M_string_length <= (ulong)(long)this->idx ||
             ((this->buffer)._M_dataplus._M_p[this->idx] != '\n'))) {
        advance(this);
      }
      return;
    }
  }
  if (this->newline == true) {
    getIndentation(this);
    return;
  }
  if (uVar5 < uVar2) {
    if ((this->buffer)._M_dataplus._M_p[uVar5] == ' ') {
      skipWhitespace(this);
      return;
    }
    if (uVar5 < uVar2) {
      if ((this->buffer)._M_dataplus._M_p[uVar5] == '\"') {
        getDoubleQuoteString(this);
        return;
      }
      if ((uVar5 < uVar2) && ((this->buffer)._M_dataplus._M_p[uVar5] == '\'')) {
        getSingleQuoteString(this);
        return;
      }
    }
  }
  cVar1 = (this->buffer)._M_dataplus._M_p[uVar5];
  if ((byte)(cVar1 - 0x30U) < 10) {
    getNumber(this);
    return;
  }
  if ((0x19 < (byte)(cVar1 + 0x9fU)) && (cVar1 != '_' && 0x19 < (byte)(cVar1 + 0xbfU))) {
    uStack_18 = in_RAX;
    bVar4 = isOperator(this);
    if (!bVar4) {
      uStack_18 = CONCAT17(cVar1,(undefined7)uStack_18);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)((long)&uStack_18 + 7),1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      return;
    }
    getOperator(this);
    return;
  }
  getKeywordOrIdentifier(this);
  return;
}

Assistant:

void Lex::getNextToken() {
    if (lookahead('\n')) {
        if (!newline && blockStack.size() == 0) {
            createToken(TK_NEWLINE);
        }

        advance();
    } else if (lookahead('#')) {
        skipComment();
    } else if (newline) {
        getIndentation();
    } else if (lookahead(' ')) {
        skipWhitespace();
    } else if (lookahead('"')) {
        getDoubleQuoteString();
    } else if (lookahead('\'')) {
        getSingleQuoteString();
    } else if (isDigit()) {
        getNumber();
    } else if (isAlpha()) {
        getKeywordOrIdentifier();
    } else if (isOperator()) {
        getOperator();
    } else {
        std::cout << buffer[idx] << "\n";
    }
}